

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<32,151>::LimitedBreitWignerLValue::
LimitedBreitWignerLValue<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (LimitedBreitWignerLValue *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *end,long *lineNumber,int MAT,int MF,int MT)

{
  ListRecord local_58;
  
  ListRecord::ListRecord<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (&local_58,it,end,lineNumber,MAT,MF,MT);
  Type<32,_151>::LimitedBreitWignerLValue::LimitedBreitWignerLValue
            ((LimitedBreitWignerLValue *)this,&local_58);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_58.data.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

LimitedBreitWignerLValue( Iterator& it, const Iterator& end, long& lineNumber,
                   int MAT, int MF, int MT ) :
   // no try ... catch: exceptions will be handled in the derived class
  LimitedBreitWignerLValue( ListRecord( it, end, lineNumber, MAT, MF, MT ) ) {}